

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallSet.h
# Opt level: O3

size_type __thiscall
llvm::SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_>::count
          (SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *this,uint *V)

{
  uint *puVar1;
  size_type sVar2;
  uint *puVar3;
  ulong uVar4;
  long lVar5;
  uint *puVar6;
  
  if ((this->Set)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                      (&this->Set,V);
    return sVar2;
  }
  puVar3 = (uint *)(this->Vector).super_SmallVectorImpl<unsigned_int>.
                   super_SmallVectorTemplateBase<unsigned_int,_true>.
                   super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX;
  uVar4 = (ulong)(this->Vector).super_SmallVectorImpl<unsigned_int>.
                 super_SmallVectorTemplateBase<unsigned_int,_true>.
                 super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size;
  puVar1 = puVar3 + uVar4;
  puVar6 = puVar1;
  if (uVar4 != 0) {
    lVar5 = uVar4 << 2;
    do {
      puVar6 = puVar3;
      if (*puVar3 == *V) break;
      puVar3 = puVar3 + 1;
      lVar5 = lVar5 + -4;
      puVar6 = puVar1;
    } while (lVar5 != 0);
  }
  return (ulong)(puVar6 != puVar1);
}

Assistant:

size_type count(const T &V) const {
    if (isSmall()) {
      // Since the collection is small, just do a linear search.
      return vfind(V) == Vector.end() ? 0 : 1;
    } else {
      return Set.count(V);
    }
  }